

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O1

Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readMapping_abi_cxx11_
          (Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  _Base_ptr p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_48_2_9b3c4038_for_Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar5;
  size_type sVar6;
  undefined8 uVar7;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined1 uVar8;
  YamlEvent event_1;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  YamlEvent event;
  string key;
  string local_140;
  undefined1 local_120 [8];
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  undefined1 local_c8;
  bool local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  bool local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ParserContext *local_68;
  anon_union_48_2_9b3c4038_for_Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_60;
  
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_60 + 8);
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a8 + 8);
  local_f8 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
  local_68 = this;
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_f0,this);
    if (local_c8 == '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "Error while reading mapping: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      local_a8._0_8_ = local_118._8_8_;
      uVar7 = local_118._0_8_;
      if (local_120 == (undefined1  [8])(local_118 + 8)) {
        local_a8._8_8_ = aStack_108._M_allocated_capacity;
        local_b8._0_8_ = local_a8;
      }
      else {
        local_b8._0_8_ = local_120;
      }
      local_118._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = local_f8;
      if ((undefined1 *)local_b8._0_8_ == local_a8) {
        local_f8->_M_allocated_capacity = local_a8._0_8_;
        (&local_f8->_M_allocated_capacity)[1] = local_a8._8_8_;
      }
      else {
        (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_b8._0_8_;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             local_a8._0_8_;
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar7;
      local_b8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
      __return_storage_ptr__->has_value_ = false;
      local_120 = (undefined1  [8])(local_118 + 8);
      local_b8._0_8_ = local_a8;
LAB_0014abb5:
      this_00 = (Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_f0;
LAB_0014ad24:
      Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                   *)&local_60.value_);
      return __return_storage_ptr__;
    }
    local_b8._0_4_ = local_f0._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._8_8_ == &aStack_d8) {
      local_a8._16_4_ = aStack_d8._8_4_;
      local_a8._20_4_ = aStack_d8._12_4_;
      local_b8._8_8_ = paVar4;
    }
    else {
      local_b8._8_8_ = local_f0._8_8_;
    }
    local_a8._8_8_ = aStack_d8._0_8_;
    local_a8._0_8_ = local_f0._16_8_;
    local_f0._16_8_ = (_Base_ptr)0x0;
    aStack_d8._0_8_ = aStack_d8._0_8_ & 0xffffffffffffff00;
    local_f0._8_8_ = &aStack_d8;
    if (local_f0._0_4_ != 6) {
      if (local_f0._0_4_ == 10) {
        p_Var1 = (_Base_ptr)((long)&__return_storage_ptr__->field_0 + 8);
        if (local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          *(undefined4 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = 0;
          *(_Base_ptr *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               p_Var1;
          *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x20) = p_Var1;
          paVar5 = &__return_storage_ptr__->field_0;
        }
        else {
          paVar5 = &local_60;
          *(_Rb_tree_color *)((long)&__return_storage_ptr__->field_0 + 8) =
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               (size_type)
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          *(_Base_ptr *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          *(_Base_ptr *)((long)&__return_storage_ptr__->field_0 + 0x20) =
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               p_Var1;
          *(size_t *)((long)&__return_storage_ptr__->field_0 + 0x28) =
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&local_60 + 8);
          local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        *(undefined8 *)((long)paVar5 + 0x28) = 0;
        __return_storage_ptr__->has_value_ = true;
      }
      else {
        format_abi_cxx11_(&local_140,"Unexpected event %d");
        sVar6 = local_140._M_string_length;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_118 + 8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p == &local_140.field_2) {
          aStack_108._M_allocated_capacity = local_140.field_2._8_8_;
          local_120 = (undefined1  [8])paVar2;
        }
        else {
          local_120 = (undefined1  [8])local_140._M_dataplus._M_p;
        }
        local_118._9_7_ = local_140.field_2._M_allocated_capacity._1_7_;
        local_118[8] = local_140.field_2._M_local_buf[0];
        local_140._M_string_length = 0;
        local_140.field_2._M_local_buf[0] = '\0';
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = local_f8;
        if (local_120 == (undefined1  [8])paVar2) {
          local_f8->_M_allocated_capacity = local_118._8_8_;
          (&local_f8->_M_allocated_capacity)[1] = aStack_108._M_allocated_capacity;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_120;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_118._8_8_;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar6;
        local_118._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_118._8_8_ = (ulong)(uint7)local_140.field_2._M_allocated_capacity._1_7_ << 8;
        __return_storage_ptr__->has_value_ = false;
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        local_120 = (undefined1  [8])paVar2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._8_8_ != paVar4) {
        operator_delete((void *)local_b8._8_8_,(ulong)(local_a8._8_8_ + 1));
      }
      goto LAB_0014abb5;
    }
    std::__cxx11::string::operator=((string *)&local_88,(string *)(local_b8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._8_8_ != paVar4) {
      operator_delete((void *)local_b8._8_8_,(ulong)(local_a8._8_8_ + 1));
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_f0);
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8,this);
    if (local_90 == false) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "Error while reading mapping: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      local_f0._16_8_ = local_118._8_8_;
      uVar7 = local_118._0_8_;
      _Var3._M_p = local_f0 + 0x10;
      if (local_120 == (undefined1  [8])(local_118 + 8)) {
        aStack_d8._0_8_ = aStack_108._M_allocated_capacity;
        local_f0._0_8_ = _Var3._M_p;
      }
      else {
        local_f0._0_8_ = local_120;
      }
      local_118._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = local_f8;
      if ((pointer)local_f0._0_8_ == _Var3._M_p) {
        local_f8->_M_allocated_capacity = local_f0._16_8_;
        (&local_f8->_M_allocated_capacity)[1] = aStack_d8._0_8_;
      }
      else {
        *(undefined8 *)&__return_storage_ptr__->field_0 = local_f0._0_8_;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             local_f0._16_8_;
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar7;
      local_f0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_f0._16_8_ = local_f0._16_8_ & 0xffffffffffffff00;
      __return_storage_ptr__->has_value_ = false;
      local_120 = (undefined1  [8])(local_118 + 8);
      local_f0._0_8_ = _Var3._M_p;
LAB_0014ad1c:
      this_00 = (Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b8;
      goto LAB_0014ad24;
    }
    local_120._0_4_ = local_b8._0_4_;
    local_118._0_8_ = &aStack_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._8_8_ == paVar4) {
      aStack_108._8_4_ = local_a8._16_4_;
      aStack_108._12_4_ = local_a8._20_4_;
    }
    else {
      local_118._0_8_ = local_b8._8_8_;
    }
    aStack_108._M_allocated_capacity = local_a8._8_8_;
    local_118._8_8_ = local_a8._0_8_;
    local_a8._0_8_ = (_Base_ptr)0x0;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    if (local_b8._0_4_ == YAML_MAPPING_START_EVENT) {
      local_b8._8_8_ = paVar4;
      readMapping_abi_cxx11_
                ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_f0,this);
      uVar8 = local_c0;
      if (local_c0 == false) {
        paVar2 = &local_140.field_2;
        local_140._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_f0._0_8_,(pointer)(local_f0._8_8_ + local_f0._0_8_));
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p == paVar2) {
          local_f8->_M_allocated_capacity =
               CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                        local_140.field_2._M_local_buf[0]);
          (&local_f8->_M_allocated_capacity)[1] = local_140.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
               local_140._M_dataplus._M_p;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                        local_140.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length =
             local_140._M_string_length;
        local_140._M_string_length = 0;
        local_140.field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->has_value_ = false;
        this = local_68;
        local_140._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
        ::_M_emplace_unique<std::__cxx11::string,yaml::Mapping>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                    *)&local_60.value_,&local_88,(Mapping *)local_f0);
      }
      Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f0);
LAB_0014a8aa:
      if (uVar8 == '\0') {
LAB_0014ad00:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._0_8_ != &aStack_108) {
          operator_delete((void *)local_118._0_8_,(ulong)(aStack_108._M_allocated_capacity + 1));
        }
        goto LAB_0014ad1c;
      }
    }
    else {
      if (local_b8._0_4_ == YAML_SEQUENCE_START_EVENT) {
        local_b8._8_8_ = paVar4;
        readSequence_abi_cxx11_
                  ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_f0,this);
        uVar8 = aStack_d8._M_local_buf[8];
        if (aStack_d8._M_local_buf[8] == '\0') {
          paVar2 = &local_140.field_2;
          local_140._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_f0._0_8_,(pointer)(local_f0._8_8_ + local_f0._0_8_))
          ;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_0 = local_f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p == paVar2) {
            local_f8->_M_allocated_capacity =
                 CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                          local_140.field_2._M_local_buf[0]);
            (&local_f8->_M_allocated_capacity)[1] = local_140.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                 local_140._M_dataplus._M_p;
            (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                 CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                          local_140.field_2._M_local_buf[0]);
          }
          (__return_storage_ptr__->field_0).error_.error_._M_string_length =
               local_140._M_string_length;
          local_140._M_string_length = 0;
          local_140.field_2._M_local_buf[0] = '\0';
          __return_storage_ptr__->has_value_ = false;
          this = local_68;
          local_140._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
          ::
          _M_emplace_unique<std::__cxx11::string,std::vector<yaml::Value,std::allocator<yaml::Value>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                      *)&local_60.value_,&local_88,
                     (vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_f0);
        }
        Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_f0);
        goto LAB_0014a8aa;
      }
      if (local_b8._0_4_ != YAML_SCALAR_EVENT) {
        local_b8._8_8_ = paVar4;
        format_abi_cxx11_(&local_140,"Unexpected event %d");
        sVar6 = local_140._M_string_length;
        _Var3._M_p = local_f0 + 0x10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p == &local_140.field_2) {
          aStack_d8._0_8_ = local_140.field_2._8_8_;
          local_f0._0_8_ = _Var3._M_p;
        }
        else {
          local_f0._0_8_ = local_140._M_dataplus._M_p;
        }
        local_f0._17_7_ = local_140.field_2._M_allocated_capacity._1_7_;
        local_f0[0x10] = local_140.field_2._M_local_buf[0];
        local_140._M_string_length = 0;
        local_140.field_2._M_local_buf[0] = '\0';
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = local_f8;
        if ((pointer)local_f0._0_8_ == _Var3._M_p) {
          local_f8->_M_allocated_capacity = local_f0._16_8_;
          (&local_f8->_M_allocated_capacity)[1] = aStack_d8._0_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_f0._0_8_
          ;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_f0._16_8_;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar6;
        local_f0._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_f0._16_8_ = (ulong)(uint7)local_140.field_2._M_allocated_capacity._1_7_ << 8;
        __return_storage_ptr__->has_value_ = false;
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        local_f0._0_8_ = _Var3._M_p;
        goto LAB_0014ad00;
      }
      local_b8._8_8_ = paVar4;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
      ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                  *)&local_60.value_,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._0_8_ != &aStack_108) {
      operator_delete((void *)local_118._0_8_,(ulong)(aStack_108._M_allocated_capacity + 1));
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
  } while( true );
}

Assistant:

Expected<Mapping, std::string> readMapping() {
		Mapping mapping;
		for (;;) {
			std::string key;
			{
				auto event_result = getNextEvent();
				if (!event_result)
					return Unexpected("Error while reading mapping: " + event_result.error());
				YamlEvent event = std::move(event_result).value();

				switch (event.type) {
					case YAML_SCALAR_EVENT:
						MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
						key = std::move(event.value);
						break;
					case YAML_MAPPING_END_EVENT:
						MSG("YAML_MAPPING_END_EVENT");
						return mapping;
					default:
						return Unexpected(format("Unexpected event %d", event.type));
					}
			}

			{
				auto event_result = getNextEvent();
				if (!event_result)
					return Unexpected("Error while reading mapping: " + event_result.error());
				YamlEvent event = std::move(event_result).value();

				switch (event.type) {
					case YAML_SCALAR_EVENT:
						MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
						mapping.map_.emplace(std::move(key), std::move(event.value));
						break;
					case YAML_SEQUENCE_START_EVENT:
						MSG("YAML_SEQUENCE_START_EVENT");
						{
							auto result = readSequence();
							if (!result)
								return Unexpected(result.error());
							mapping.map_.emplace(std::move(key), std::move(result).value());
						}
						break;
					case YAML_MAPPING_START_EVENT:
						MSG("YAML_MAPPING_START_EVENT");
						{
							auto result = readMapping();
							if (!result)
								return Unexpected(result.error());
							mapping.map_.emplace(std::move(key), std::move(result).value());
						}
						break;
					default:
						return Unexpected(format("Unexpected event %d", event.type));
				}
			}
		}
	}